

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O1

int op_test(OpusHead *_head,uchar *_initial_data,size_t _initial_bytes)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  void *__dest;
  int iVar5;
  ogg_sync_state oy;
  ogg_packet op;
  ogg_page og;
  ogg_stream_state os;
  
  if (_initial_bytes < 0x2f) {
    iVar4 = -1;
  }
  else {
    iVar4 = -0x84;
    if (*(int *)_initial_data == 0x5367674f) {
      if ((long)_initial_bytes < 0) {
        iVar4 = -0x81;
      }
      else {
        ogg_sync_init(&oy);
        __dest = (void *)ogg_sync_buffer(&oy,_initial_bytes);
        if (__dest == (void *)0x0) {
          iVar4 = -0x81;
        }
        else {
          memcpy(__dest,_initial_data,_initial_bytes);
          ogg_sync_wrote(&oy,_initial_bytes);
          ogg_stream_init(&os,0xffffffff);
          do {
            iVar2 = ogg_sync_pageout(&oy,&og);
            bVar1 = true;
            iVar5 = -1;
            iVar4 = iVar5;
            if (-1 < iVar2) {
              if (iVar2 == 0) {
                bVar1 = false;
              }
              else {
                uVar3 = ogg_page_serialno(&og);
                ogg_stream_reset_serialno(&os,uVar3);
                ogg_stream_pagein(&os,&og);
                iVar2 = ogg_stream_packetout(&os,&op);
                if (iVar2 == 1) {
                  if (op.b_o_s == 0) {
                    iVar4 = -0x84;
                  }
                  else {
                    iVar4 = opus_head_parse(_head,op.packet,op.bytes);
                    if (iVar4 == -0x84) {
                      iVar4 = iVar5;
                    }
                  }
                }
              }
            }
          } while ((bVar1) && (iVar4 == -1));
          ogg_stream_clear(&os);
        }
        ogg_sync_clear(&oy);
      }
    }
  }
  return iVar4;
}

Assistant:

int op_test(OpusHead *_head,
 const unsigned char *_initial_data,size_t _initial_bytes){
  ogg_sync_state  oy;
  char           *data;
  int             err;
  /*The first page of a normal Opus file will be at most 57 bytes (27 Ogg
     page header bytes + 1 lacing value + 21 Opus header bytes + 8 channel
     mapping bytes).
    It will be at least 47 bytes (27 Ogg page header bytes + 1 lacing value +
     19 Opus header bytes using channel mapping family 0).
    If we don't have at least that much data, give up now.*/
  if(_initial_bytes<47)return OP_FALSE;
  /*Only proceed if we start with the magic OggS string.
    This is to prevent us spending a lot of time allocating memory and looking
     for Ogg pages in non-Ogg files.*/
  if(memcmp(_initial_data,"OggS",4)!=0)return OP_ENOTFORMAT;
  if(OP_UNLIKELY(_initial_bytes>(size_t)LONG_MAX))return OP_EFAULT;
  ogg_sync_init(&oy);
  data=ogg_sync_buffer(&oy,(long)_initial_bytes);
  if(data!=NULL){
    ogg_stream_state os;
    ogg_page         og;
    int              ret;
    memcpy(data,_initial_data,_initial_bytes);
    ogg_sync_wrote(&oy,(long)_initial_bytes);
    ogg_stream_init(&os,-1);
    err=OP_FALSE;
    do{
      ogg_packet op;
      ret=ogg_sync_pageout(&oy,&og);
      /*Ignore holes.*/
      if(ret<0)continue;
      /*Stop if we run out of data.*/
      if(!ret)break;
      ogg_stream_reset_serialno(&os,ogg_page_serialno(&og));
      ogg_stream_pagein(&os,&og);
      /*Only process the first packet on this page (if it's a BOS packet,
         it's required to be the only one).*/
      if(ogg_stream_packetout(&os,&op)==1){
        if(op.b_o_s){
          ret=opus_head_parse(_head,op.packet,op.bytes);
          /*If this didn't look like Opus, keep going.*/
          if(ret==OP_ENOTFORMAT)continue;
          /*Otherwise we're done, one way or another.*/
          err=ret;
        }
        /*We finished parsing the headers.
          There is no Opus to be found.*/
        else err=OP_ENOTFORMAT;
      }
    }
    while(err==OP_FALSE);
    ogg_stream_clear(&os);
  }
  else err=OP_EFAULT;
  ogg_sync_clear(&oy);
  return err;
}